

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* adios2::helper::AvailableIpAddresses_abi_cxx11_(void)

{
  bool bVar1;
  int __fd;
  int iVar2;
  if_nameindex *piVar3;
  char *pcVar4;
  int *piVar5;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  allocator local_81;
  if_nameindex *local_80;
  ifreq req;
  string ip;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  __fd = socket(2,2,0);
  if (-1 < __fd) {
    piVar3 = if_nameindex();
    if (piVar3 != (if_nameindex *)0x0) {
      local_80 = piVar3;
      for (; piVar3->if_index != 0 || piVar3->if_name != (char *)0x0; piVar3 = piVar3 + 1) {
        strncpy((char *)&req,piVar3->if_name,0xf);
        iVar2 = ioctl(__fd,0x8915,&req);
        if (iVar2 < 0) {
          piVar5 = __errno_location();
          if (*piVar5 != 99) {
            if_freenameindex(local_80);
            close(__fd);
            return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDI;
          }
        }
        else {
          pcVar4 = inet_ntoa((in_addr)req.ifr_ifru.ifru_map.mem_start._4_4_);
          std::__cxx11::string::string((string *)&ip,pcVar4,&local_81);
          bVar1 = std::operator!=(&ip,"127.0.0.1");
          if (bVar1) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>(in_RDI,&ip);
          }
          std::__cxx11::string::~string((string *)&ip);
        }
      }
      if_freenameindex(local_80);
    }
    close(__fd);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string>
AvailableIpAddresses() noexcept
{
    std::vector<std::string> ips;
    int socket_handler = -1;
    if ((socket_handler = socket(PF_INET, SOCK_DGRAM, 0)) < 0)
    {
        return ips;
    }
    struct if_nameindex *head = if_nameindex();
    if (!head)
    {
        close(socket_handler);
        return ips;
    }
    for (struct if_nameindex *p = head; !(p->if_index == 0 && p->if_name == NULL); ++p)
    {
        struct ifreq req;
        strncpy(req.ifr_name, p->if_name, IFNAMSIZ - 1);
        if (ioctl(socket_handler, SIOCGIFADDR, &req) < 0)
        {
            if (errno == EADDRNOTAVAIL)
            {
                continue;
            }
            if_freenameindex(head);
            close(socket_handler);
            return ips;
        }
        const std::string ip = inet_ntoa(((struct sockaddr_in *)&req.ifr_addr)->sin_addr);
        if (ip != "127.0.0.1")
        {
            ips.emplace_back(ip);
        }
    }
    if_freenameindex(head);
    close(socket_handler);
    return ips;
}